

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_abs<int>(uint length)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  shared_ptr<int> pv;
  
  uVar6 = (ulong)length;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar4 = uVar6 * 4;
  }
  puVar1 = (undefined4 *)operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,puVar1,nosimd::common::free<int>);
  if (0 < (int)length) {
    lVar3 = 0;
    puVar5 = puVar1;
    do {
      *puVar5 = (int)lVar3;
      lVar3 = lVar3 + -1;
      puVar5 = puVar5 + 1;
    } while (uVar6 + lVar3 != 0);
    if (0 < (int)length) {
      uVar4 = 0;
      do {
        if ((int)puVar1[uVar4] < 0) {
          puVar1[uVar4] = -puVar1[uVar4];
        }
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
      if (0 < (int)length) {
        uVar4 = 0;
        do {
          if (0x80000000 < (uint)puVar1[uVar4]) {
            puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar2 = "void test_abs(unsigned int) [T = int]";
            *(undefined4 *)(puVar2 + 1) = 0x81;
            *(uint *)((long)puVar2 + 0xc) = length;
            __cxa_throw(puVar2,&Exception::typeinfo,0);
          }
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
    }
  }
  if (pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}